

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O1

int ssymm_(char *side,char *uplo,integer *m,integer *n,real *alpha,real *a,integer *lda,real *b,
          integer *ldb,real *beta,real *c__,integer *ldc)

{
  long lVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  integer iVar7;
  logical lVar8;
  logical lVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  real *prVar20;
  long lVar21;
  real *prVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  integer *piVar29;
  real *prVar30;
  int iVar31;
  ulong uVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  
  iVar31 = *lda;
  uVar12 = (ulong)iVar31;
  iVar10 = *ldb;
  uVar13 = (ulong)iVar10;
  iVar28 = *ldc;
  uVar14 = (ulong)iVar28;
  lVar8 = lsame_(side,"L");
  piVar29 = m;
  if (lVar8 == 0) {
    piVar29 = n;
  }
  iVar16 = *piVar29;
  lVar8 = lsame_(uplo,"U");
  ssymm_::info = 0;
  lVar9 = lsame_(side,"L");
  if ((lVar9 == 0) && (lVar9 = lsame_(side,"R"), lVar9 == 0)) {
    iVar7 = 1;
  }
  else if ((lVar8 == 0) && (lVar9 = lsame_(uplo,"L"), lVar9 == 0)) {
    iVar7 = 2;
  }
  else {
    iVar23 = *m;
    if (iVar23 < 0) {
      iVar7 = 3;
    }
    else if (*n < 0) {
      iVar7 = 4;
    }
    else {
      if (iVar16 < 2) {
        iVar16 = 1;
      }
      iVar7 = 7;
      if (iVar16 <= *lda) {
        iVar16 = 1;
        if (1 < iVar23) {
          iVar16 = iVar23;
        }
        iVar7 = 9;
        if ((iVar16 <= *ldb) && (iVar7 = 0xc, iVar16 <= *ldc)) {
          iVar7 = ssymm_::info;
        }
      }
    }
  }
  ssymm_::info = iVar7;
  if (ssymm_::info == 0) {
    if (*m != 0) {
      uVar3 = *n;
      uVar15 = (ulong)uVar3;
      if (uVar15 != 0) {
        uVar17 = ~uVar14;
        fVar34 = *alpha;
        if ((fVar34 == 0.0) && (!NAN(fVar34))) {
          if ((*beta == 1.0) && (!NAN(*beta))) {
            return 0;
          }
          if ((fVar34 == 0.0) && (!NAN(fVar34))) {
            ssymm_::j = 1;
            if ((*beta == 0.0) && (!NAN(*beta))) {
              if ((int)uVar3 < 1) {
                ssymm_::j = 1;
                return 0;
              }
              uVar3 = *m;
              iVar31 = iVar28 + 1;
              uVar12 = 0;
              do {
                if ((int)uVar3 < 1) {
                  iVar10 = 1;
                }
                else {
                  memset(c__ + uVar17 + (long)iVar31,0,(ulong)uVar3 << 2);
                  iVar10 = uVar3 + 1;
                }
                uVar12 = uVar12 + 1;
                iVar31 = iVar31 + iVar28;
              } while (uVar15 != uVar12);
              ssymm_::i__ = iVar10;
              ssymm_::j = (int)uVar12 + 1;
              return 0;
            }
            if ((int)uVar3 < 1) {
              ssymm_::j = 1;
              return 0;
            }
            iVar31 = *m;
            prVar20 = c__ + uVar14 + uVar17;
            lVar19 = 1;
            do {
              if (iVar31 < 1) {
                uVar12 = 1;
              }
              else {
                uVar12 = 1;
                do {
                  prVar20[uVar12] = *beta * prVar20[uVar12];
                  uVar12 = uVar12 + 1;
                } while (iVar31 + 1 != uVar12);
              }
              lVar19 = lVar19 + 1;
              prVar20 = prVar20 + uVar14;
            } while (lVar19 != uVar15 + 1);
            ssymm_::i__ = (integer)uVar12;
            ssymm_::j = (integer)lVar19;
            return 0;
          }
        }
        uVar18 = ~uVar12;
        uVar15 = ~uVar13;
        lVar9 = lsame_(side,"L");
        if (lVar9 == 0) {
          uVar3 = *n;
          ssymm_::j = 1;
          if (0 < (int)uVar3) {
            iVar28 = *m;
            iVar16 = 1;
            if (lVar8 == 0) {
              iVar16 = iVar31;
            }
            iVar23 = 1;
            if (lVar8 != 0) {
              iVar23 = iVar31;
            }
            iVar11 = *n;
            ssymm_::j = 1;
            prVar30 = c__ + uVar14 + uVar17;
            uVar12 = 1;
            prVar20 = b + uVar13 + uVar15;
            do {
              fVar34 = *alpha;
              fVar35 = a[uVar18 + (long)((iVar31 + 1) * (int)uVar12)];
              if ((*beta != 0.0) || (NAN(*beta))) {
                if (iVar28 < 1) goto LAB_001161e8;
                uVar17 = 1;
                do {
                  prVar30[uVar17] = *beta * prVar30[uVar17] + prVar20[uVar17] * fVar34 * fVar35;
                  uVar17 = uVar17 + 1;
                } while (iVar28 + 1 != uVar17);
              }
              else if (iVar28 < 1) {
LAB_001161e8:
                uVar17 = 1;
              }
              else {
                uVar17 = 1;
                do {
                  prVar30[uVar17] = prVar20[uVar17] * fVar34 * fVar35;
                  uVar17 = uVar17 + 1;
                } while (iVar28 + 1 != uVar17);
              }
              ssymm_::i__ = (integer)uVar17;
              if (1 < uVar12) {
                iVar5 = *m;
                uVar17 = 1;
                prVar22 = b + uVar13 + uVar15;
                do {
                  if (iVar5 < 1) {
                    uVar27 = 1;
                  }
                  else {
                    fVar34 = *alpha;
                    fVar35 = a[uVar18 + uVar12 * (long)iVar23 + uVar17 * (long)iVar16];
                    uVar27 = 1;
                    do {
                      prVar30[uVar27] = prVar22[uVar27] * fVar34 * fVar35 + prVar30[uVar27];
                      uVar27 = uVar27 + 1;
                    } while (iVar5 + 1 != uVar27);
                  }
                  ssymm_::i__ = (integer)uVar27;
                  uVar17 = uVar17 + 1;
                  prVar22 = prVar22 + uVar13;
                } while (uVar17 != uVar12);
              }
              ssymm_::k = ssymm_::j + 1;
              if (ssymm_::j < iVar11) {
                iVar5 = *m;
                iVar24 = iVar10 * ssymm_::k;
                iVar6 = ssymm_::k;
                do {
                  if (iVar5 < 1) {
                    uVar17 = 1;
                  }
                  else {
                    fVar34 = *alpha;
                    fVar35 = a[uVar18 + uVar12 * (long)iVar16 + (long)(iVar6 * iVar23)];
                    uVar17 = 1;
                    do {
                      prVar30[uVar17] =
                           b[uVar15 + (long)iVar24 + uVar17] * fVar34 * fVar35 + prVar30[uVar17];
                      uVar17 = uVar17 + 1;
                    } while (iVar5 + 1 != uVar17);
                  }
                  ssymm_::i__ = (integer)uVar17;
                  ssymm_::k = iVar6 + 1;
                  iVar24 = iVar24 + iVar10;
                  bVar33 = iVar6 < iVar11;
                  iVar6 = ssymm_::k;
                } while (bVar33);
              }
              uVar12 = uVar12 + 1;
              ssymm_::j = (integer)uVar12;
              prVar20 = prVar20 + uVar13;
              prVar30 = prVar30 + uVar14;
            } while (uVar12 != (ulong)uVar3 + 1);
          }
        }
        else {
          uVar3 = *n;
          ssymm_::j = 1;
          if (lVar8 == 0) {
            if (0 < (int)uVar3) {
              uVar4 = *m;
              lVar19 = 1;
              do {
                uVar27 = (ulong)uVar4;
                if (0 < (int)uVar4) {
                  lVar21 = lVar19 * uVar14;
                  iVar10 = *m;
                  uVar32 = (ulong)uVar4;
                  iVar28 = uVar4 + 1;
                  do {
                    iVar16 = iVar28;
                    if (iVar28 < iVar10) {
                      iVar16 = iVar10;
                    }
                    fVar34 = *alpha * b[uVar15 + lVar19 * uVar13 + uVar32];
                    iVar23 = (int)uVar32;
                    ssymm_::k = iVar23 + 1;
                    fVar35 = 0.0;
                    if (iVar23 < iVar10) {
                      iVar11 = ssymm_::k;
                      do {
                        lVar25 = (long)iVar11;
                        c__[uVar17 + lVar19 * uVar14 + lVar25] =
                             a[uVar18 + uVar32 * uVar12 + lVar25] * fVar34 +
                             c__[uVar17 + lVar19 * uVar14 + lVar25];
                        fVar35 = fVar35 + b[uVar15 + lVar19 * uVar13 + lVar25] *
                                          a[uVar18 + uVar32 * uVar12 + lVar25];
                        ssymm_::k = iVar11 + 1;
                        bVar33 = iVar11 != iVar16;
                        iVar11 = ssymm_::k;
                      } while (bVar33);
                    }
                    fVar2 = *beta;
                    if ((fVar2 != 0.0) || (NAN(fVar2))) {
                      c__[uVar17 + lVar21 + uVar32] =
                           fVar35 * *alpha +
                           fVar2 * c__[uVar17 + lVar21 + uVar32] +
                           fVar34 * a[uVar18 + (long)((iVar31 + 1) * iVar23)];
                    }
                    else {
                      c__[uVar17 + lVar21 + uVar32] =
                           fVar34 * a[uVar18 + (long)((iVar31 + 1) * iVar23)] + fVar35 * *alpha;
                    }
                    uVar27 = uVar32 - 1;
                    iVar28 = iVar28 + -1;
                    bVar33 = 1 < (long)uVar32;
                    uVar32 = uVar27;
                  } while (bVar33);
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 != (ulong)uVar3 + 1);
              ssymm_::i__ = (integer)uVar27;
              ssymm_::j = (integer)lVar19;
            }
          }
          else if (0 < (int)uVar3) {
            uVar4 = *m;
            prVar20 = b + uVar13 + uVar15;
            prVar30 = c__ + uVar14 + uVar17;
            lVar19 = 1;
            do {
              if ((int)uVar4 < 1) {
                uVar27 = 1;
              }
              else {
                lVar21 = lVar19 * uVar14;
                uVar27 = 1;
                lVar25 = 0;
                prVar22 = a + uVar12 + uVar18;
                do {
                  fVar34 = *alpha * b[uVar15 + lVar19 * uVar13 + uVar27];
                  if (uVar27 < 2) {
                    lVar26 = 1;
                    fVar35 = 0.0;
                  }
                  else {
                    fVar35 = 0.0;
                    lVar26 = 1;
                    do {
                      prVar30[lVar26] = prVar22[lVar26] * fVar34 + prVar30[lVar26];
                      fVar35 = fVar35 + prVar20[lVar26] * prVar22[lVar26];
                      lVar1 = lVar25 + lVar26;
                      lVar26 = lVar26 + 1;
                    } while (lVar1 != 0);
                  }
                  fVar2 = *beta;
                  if ((fVar2 != 0.0) || (NAN(fVar2))) {
                    c__[uVar17 + lVar21 + uVar27] =
                         fVar35 * *alpha +
                         fVar2 * c__[uVar17 + lVar21 + uVar27] +
                         fVar34 * a[uVar18 + (long)((iVar31 + 1) * (int)uVar27)];
                  }
                  else {
                    c__[uVar17 + lVar21 + uVar27] =
                         fVar34 * a[uVar18 + (long)((iVar31 + 1) * (int)uVar27)] + fVar35 * *alpha;
                  }
                  uVar27 = uVar27 + 1;
                  prVar22 = prVar22 + uVar12;
                  lVar25 = lVar25 + -1;
                } while (uVar27 != (ulong)uVar4 + 1);
                ssymm_::k = (integer)lVar26;
              }
              lVar19 = lVar19 + 1;
              prVar20 = prVar20 + uVar13;
              prVar30 = prVar30 + uVar14;
            } while (lVar19 != (ulong)uVar3 + 1);
            ssymm_::i__ = (integer)uVar27;
            ssymm_::j = (integer)lVar19;
          }
        }
      }
    }
  }
  else {
    xerbla_("SSYMM ",&ssymm_::info);
  }
  return 0;
}

Assistant:

int ssymm_(char *side, char *uplo, integer *m, integer *n,
	real *alpha, real *a, integer *lda, real *b, integer *ldb, real *beta,
	 real *c__, integer *ldc)
{
    /* System generated locals */
    integer a_dim1, a_offset, b_dim1, b_offset, c_dim1, c_offset, i__1, i__2,
	    i__3;

    /* Local variables */
    static integer i__, j, k, info;
    static real temp1, temp2;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);


/*
    Purpose
    =======

    SSYMM  performs one of the matrix-matrix operations

       C := alpha*A*B + beta*C,

    or

       C := alpha*B*A + beta*C,

    where alpha and beta are scalars,  A is a symmetric matrix and  B and
    C are  m by n matrices.

    Parameters
    ==========

    SIDE   - CHARACTER*1.
             On entry,  SIDE  specifies whether  the  symmetric matrix  A
             appears on the  left or right  in the  operation as follows:

                SIDE = 'L' or 'l'   C := alpha*A*B + beta*C,

                SIDE = 'R' or 'r'   C := alpha*B*A + beta*C,

             Unchanged on exit.

    UPLO   - CHARACTER*1.
             On  entry,   UPLO  specifies  whether  the  upper  or  lower
             triangular  part  of  the  symmetric  matrix   A  is  to  be
             referenced as follows:

                UPLO = 'U' or 'u'   Only the upper triangular part of the
                                    symmetric matrix is to be referenced.

                UPLO = 'L' or 'l'   Only the lower triangular part of the
                                    symmetric matrix is to be referenced.

             Unchanged on exit.

    M      - INTEGER.
             On entry,  M  specifies the number of rows of the matrix  C.
             M  must be at least zero.
             Unchanged on exit.

    N      - INTEGER.
             On entry, N specifies the number of columns of the matrix C.
             N  must be at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry, ALPHA specifies the scalar alpha.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, ka ), where ka is
             m  when  SIDE = 'L' or 'l'  and is  n otherwise.
             Before entry  with  SIDE = 'L' or 'l',  the  m by m  part of
             the array  A  must contain the  symmetric matrix,  such that
             when  UPLO = 'U' or 'u', the leading m by m upper triangular
             part of the array  A  must contain the upper triangular part
             of the  symmetric matrix and the  strictly  lower triangular
             part of  A  is not referenced,  and when  UPLO = 'L' or 'l',
             the leading  m by m  lower triangular part  of the  array  A
             must  contain  the  lower triangular part  of the  symmetric
             matrix and the  strictly upper triangular part of  A  is not
             referenced.
             Before entry  with  SIDE = 'R' or 'r',  the  n by n  part of
             the array  A  must contain the  symmetric matrix,  such that
             when  UPLO = 'U' or 'u', the leading n by n upper triangular
             part of the array  A  must contain the upper triangular part
             of the  symmetric matrix and the  strictly  lower triangular
             part of  A  is not referenced,  and when  UPLO = 'L' or 'l',
             the leading  n by n  lower triangular part  of the  array  A
             must  contain  the  lower triangular part  of the  symmetric
             matrix and the  strictly upper triangular part of  A  is not
             referenced.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
             LDA must be at least  max( 1, m ), otherwise  LDA must be at
             least  max( 1, n ).
             Unchanged on exit.

    B      - REAL             array of DIMENSION ( LDB, n ).
             Before entry, the leading  m by n part of the array  B  must
             contain the matrix B.
             Unchanged on exit.

    LDB    - INTEGER.
             On entry, LDB specifies the first dimension of B as declared
             in  the  calling  (sub)  program.   LDB  must  be  at  least
             max( 1, m ).
             Unchanged on exit.

    BETA   - REAL            .
             On entry,  BETA  specifies the scalar  beta.  When  BETA  is
             supplied as zero then C need not be set on input.
             Unchanged on exit.

    C      - REAL             array of DIMENSION ( LDC, n ).
             Before entry, the leading  m by n  part of the array  C must
             contain the matrix  C,  except when  beta  is zero, in which
             case C need not be set on entry.
             On exit, the array  C  is overwritten by the  m by n updated
             matrix.

    LDC    - INTEGER.
             On entry, LDC specifies the first dimension of C as declared
             in  the  calling  (sub)  program.   LDC  must  be  at  least
             max( 1, m ).
             Unchanged on exit.


    Level 3 Blas routine.

    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Set NROWA as the number of rows of A.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    b_dim1 = *ldb;
    b_offset = 1 + b_dim1;
    b -= b_offset;
    c_dim1 = *ldc;
    c_offset = 1 + c_dim1;
    c__ -= c_offset;

    /* Function Body */
    if (lsame_(side, "L")) {
	nrowa = *m;
    } else {
	nrowa = *n;
    }
    upper = lsame_(uplo, "U");

/*     Test the input parameters. */

    info = 0;
    if (! lsame_(side, "L") && ! lsame_(side, "R")) {
	info = 1;
    } else if (! upper && ! lsame_(uplo, "L")) {
	info = 2;
    } else if (*m < 0) {
	info = 3;
    } else if (*n < 0) {
	info = 4;
    } else if (*lda < max(1,nrowa)) {
	info = 7;
    } else if (*ldb < max(1,*m)) {
	info = 9;
    } else if (*ldc < max(1,*m)) {
	info = 12;
    }
    if (info != 0) {
	xerbla_("SSYMM ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*m == 0 || *n == 0 || (*alpha == 0.f && *beta == 1.f)) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	if (*beta == 0.f) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = 0.f;
/* L10: */
		}
/* L20: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1];
/* L30: */
		}
/* L40: */
	    }
	}
	return 0;
    }

/*     Start the operations. */

    if (lsame_(side, "L")) {

/*        Form  C := alpha*A*B + beta*C. */

	if (upper) {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    temp1 = *alpha * b[i__ + j * b_dim1];
		    temp2 = 0.f;
		    i__3 = i__ - 1;
		    for (k = 1; k <= i__3; ++k) {
			c__[k + j * c_dim1] += temp1 * a[k + i__ * a_dim1];
			temp2 += b[k + j * b_dim1] * a[k + i__ * a_dim1];
/* L50: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = temp1 * a[i__ + i__ * a_dim1]
				+ *alpha * temp2;
		    } else {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1]
				+ temp1 * a[i__ + i__ * a_dim1] + *alpha *
				temp2;
		    }
/* L60: */
		}
/* L70: */
	    }
	} else {
	    i__1 = *n;
	    for (j = 1; j <= i__1; ++j) {
		for (i__ = *m; i__ >= 1; --i__) {
		    temp1 = *alpha * b[i__ + j * b_dim1];
		    temp2 = 0.f;
		    i__2 = *m;
		    for (k = i__ + 1; k <= i__2; ++k) {
			c__[k + j * c_dim1] += temp1 * a[k + i__ * a_dim1];
			temp2 += b[k + j * b_dim1] * a[k + i__ * a_dim1];
/* L80: */
		    }
		    if (*beta == 0.f) {
			c__[i__ + j * c_dim1] = temp1 * a[i__ + i__ * a_dim1]
				+ *alpha * temp2;
		    } else {
			c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1]
				+ temp1 * a[i__ + i__ * a_dim1] + *alpha *
				temp2;
		    }
/* L90: */
		}
/* L100: */
	    }
	}
    } else {

/*        Form  C := alpha*B*A + beta*C. */

	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    temp1 = *alpha * a[j + j * a_dim1];
	    if (*beta == 0.f) {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = temp1 * b[i__ + j * b_dim1];
/* L110: */
		}
	    } else {
		i__2 = *m;
		for (i__ = 1; i__ <= i__2; ++i__) {
		    c__[i__ + j * c_dim1] = *beta * c__[i__ + j * c_dim1] +
			    temp1 * b[i__ + j * b_dim1];
/* L120: */
		}
	    }
	    i__2 = j - 1;
	    for (k = 1; k <= i__2; ++k) {
		if (upper) {
		    temp1 = *alpha * a[k + j * a_dim1];
		} else {
		    temp1 = *alpha * a[j + k * a_dim1];
		}
		i__3 = *m;
		for (i__ = 1; i__ <= i__3; ++i__) {
		    c__[i__ + j * c_dim1] += temp1 * b[i__ + k * b_dim1];
/* L130: */
		}
/* L140: */
	    }
	    i__2 = *n;
	    for (k = j + 1; k <= i__2; ++k) {
		if (upper) {
		    temp1 = *alpha * a[j + k * a_dim1];
		} else {
		    temp1 = *alpha * a[k + j * a_dim1];
		}
		i__3 = *m;
		for (i__ = 1; i__ <= i__3; ++i__) {
		    c__[i__ + j * c_dim1] += temp1 * b[i__ + k * b_dim1];
/* L150: */
		}
/* L160: */
	    }
/* L170: */
	}
    }

    return 0;

/*     End of SSYMM . */

}